

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
          (ShaderImageLoadStoreBase *this,vec4 *v0,vec4 *v1,GLenum internalformat)

{
  float fVar1;
  int i;
  long lVar2;
  uint uVar3;
  float local_10 [4];
  
  uVar3 = (int)v1 - 0x8f94;
  if (uVar3 < 8) {
    if ((0xbU >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0xb0U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_009999eb;
      lVar2 = 0;
      do {
        local_10[lVar2] = 0.0001;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
    }
    else {
      lVar2 = 0;
      do {
        local_10[lVar2] = 0.01;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
    }
    if (((ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper - v0->m_data[0])
          <= local_10[0]) &&
        (ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4) -
             v0->m_data[1]) <= local_10[1])) &&
       (ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
            v0->m_data[2]) <= local_10[2])) {
      return ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.
                                   m_gl + 4) - v0->m_data[3]) <= local_10[3];
    }
  }
  else {
LAB_009999eb:
    fVar1 = *(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
    if ((fVar1 == v0->m_data[0]) && (!NAN(fVar1) && !NAN(v0->m_data[0]))) {
      fVar1 = *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4);
      if ((fVar1 == v0->m_data[1]) && (!NAN(fVar1) && !NAN(v0->m_data[1]))) {
        fVar1 = *(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl;
        if ((fVar1 == v0->m_data[2]) && (!NAN(fVar1) && !NAN(v0->m_data[2]))) {
          return (bool)(-(v0->m_data[3] ==
                         *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.
                                           super_CallLogWrapper.m_gl + 4)) & 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool Equal(const vec4& v0, const vec4& v1, GLenum internalformat)
	{
		if (internalformat == GL_RGBA16_SNORM || internalformat == GL_RG16_SNORM || internalformat == GL_R16_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.0001f));
		}
		else if (internalformat == GL_RGBA8_SNORM || internalformat == GL_RG8_SNORM || internalformat == GL_R8_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.01f));
		}
		return (v0[0] == v1[0]) && (v0[1] == v1[1]) && (v0[2] == v1[2]) && (v0[3] == v1[3]);
	}